

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpproxy.cpp
# Opt level: O2

int __thiscall tcpproxy::do_accept(tcpproxy *this,int connectfd)

{
  uint32 *puVar1;
  ushort uVar2;
  naiveconfig *pnVar3;
  undefined4 uVar4;
  uint __fd;
  int *piVar5;
  uint *puVar6;
  mapped_type *pmVar7;
  undefined1 local_48 [8];
  sockaddr_in dest_addr;
  int connectfd_local;
  
  dest_addr.sin_zero._0_4_ = connectfd;
  __fd = socket(2,1,6);
  dest_addr.sin_zero._4_4_ = __fd;
  bzero((sockaddr *)local_48,0x10);
  local_48._0_2_ = 2;
  pnVar3 = (this->super_proxy).cfg;
  uVar2 = pnVar3->dest_port;
  local_48._2_2_ = uVar2 << 8 | uVar2 >> 8;
  local_48._4_4_ = pnVar3->dest_ipaddr;
  (*(this->super_proxy)._vptr_proxy[7])(this,(ulong)__fd);
  (*(this->super_proxy)._vptr_proxy[7])(this,(ulong)(uint)connectfd);
  connect(__fd,(sockaddr *)local_48,0x10);
  piVar5 = __errno_location();
  if (*piVar5 == 0x73) {
    puVar6 = (uint *)std::__detail::
                     _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&this->sfh,(key_type *)dest_addr.sin_zero);
    uVar4 = dest_addr.sin_zero._0_4_;
    *puVar6 = __fd;
    pmVar7 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->sfh,(key_type *)(dest_addr.sin_zero + 4));
    *pmVar7 = uVar4;
    puVar1 = &((this->super_proxy).cfg)->client_num;
    *puVar1 = *puVar1 + 1;
    epoll_addfd(this,dest_addr.sin_zero._0_4_);
    epoll_addfd(this,dest_addr.sin_zero._4_4_);
  }
  else {
    dest_addr.sin_zero._4_4_ = -1;
  }
  return dest_addr.sin_zero._4_4_;
}

Assistant:

int tcpproxy::do_accept(int connectfd)
{

    int dest_fd = 0;
    dest_fd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);

    struct sockaddr_in dest_addr;
    bzero(&dest_addr, sizeof(dest_addr));
    dest_addr.sin_family = AF_INET;
    dest_addr.sin_port = htons(cfg->dest_port);
    dest_addr.sin_addr.s_addr = cfg->dest_ipaddr;

    setnonblocking(dest_fd);
    setnonblocking(connectfd);
    connect(dest_fd, (struct sockaddr *)&dest_addr, sizeof(dest_addr));
    if (errno != EINPROGRESS)
    {
        //perror("connect");
        return -1;
    }

    sfh[connectfd] = dest_fd;
    sfh[dest_fd] = connectfd;

    //连接计数+1
    cfg->client_num++;

    //将两个socket添加到epoll事件中
    epoll_addfd(connectfd);
    epoll_addfd(dest_fd);

    return dest_fd;
}